

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O2

TRIPLERGB **
decimationEjection(BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,TRIPLERGB **mrx,int k,
                  char *filepath)

{
  TRIPLERGB *pTVar1;
  ulong uVar2;
  BITMAPINFOHEADER bmInfo_00;
  int iVar3;
  int iVar4;
  TRIPLERGB **matrix;
  TRIPLERGB *pTVar5;
  size_t i;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  
  uVar2 = (ulong)bmInfo.biWidth / (ulong)(uint)k;
  iVar3 = (int)uVar2;
  uVar6 = (ulong)bmInfo.biHeight / (ulong)(uint)k;
  iVar4 = (int)uVar6;
  matrix = (TRIPLERGB **)operator_new__(uVar6 * 8);
  iVar7 = 0;
  for (uVar6 = 0; uVar6 != bmInfo.biHeight; uVar6 = uVar6 + 1) {
    if (uVar6 % (ulong)(long)k == (long)(k + -1)) {
      pTVar5 = (TRIPLERGB *)operator_new__(uVar2 * 3);
      matrix[iVar7] = pTVar5;
      iVar9 = 0;
      lVar10 = 2;
      for (uVar8 = 0; bmInfo.biWidth != uVar8; uVar8 = uVar8 + 1) {
        if (uVar8 % (ulong)(long)k == (long)(k + -1)) {
          pTVar1 = mrx[uVar6];
          pTVar5[iVar9].red = (&pTVar1->blue)[lVar10];
          pTVar5[iVar9].green = *(uchar *)((long)pTVar1 + lVar10 + -1);
          pTVar5[iVar9].blue = *(uchar *)((long)pTVar1 + lVar10 + -2);
          iVar9 = iVar9 + 1;
        }
        lVar10 = lVar10 + 3;
      }
      iVar7 = iVar7 + 1;
    }
  }
  bmInfo_00.biWidth = iVar3;
  bmInfo_00.biSize = bmInfo.biSize;
  bmInfo_00.biPlanes = bmInfo.biPlanes;
  bmInfo_00.biBitCount = bmInfo.biBitCount;
  bmInfo_00.biHeight = iVar4;
  bmInfo_00.biSizeImage = iVar3 * iVar4 * 3;
  bmInfo_00.biCompression = bmInfo.biCompression;
  bmInfo_00.biXPelsPerMeter = bmInfo.biXPelsPerMeter;
  bmInfo_00.biYPelsPerMeter = bmInfo.biYPelsPerMeter;
  bmInfo_00.biClrUsed = bmInfo.biClrUsed;
  bmInfo_00.biClrImportant = bmInfo.biClrImportant;
  saveBMPFile(bmFile,bmInfo_00,matrix,filepath);
  return matrix;
}

Assistant:

TRIPLERGB **decimationEjection(BITMAPFILEHEADER bmFile,
                               BITMAPINFOHEADER bmInfo,
                               TRIPLERGB **mrx, int k, const char *filepath) {
    unsigned int originH = bmInfo.biHeight;
    unsigned int originW = bmInfo.biWidth;
    bmInfo.biWidth = originW / k;
    bmInfo.biHeight = originH / k;
    bmInfo.biSizeImage = bmInfo.biWidth * bmInfo.biHeight * 3;
    //cout << "Decimation... New size = " << m_bmInfo.biSizeImage << "\n";
    TRIPLERGB **decMrx = new TRIPLERGB *[bmInfo.biHeight];
    int idH = 0;
    for (size_t i = 0; i < originH; i++) {
        if ((i % k) == (k - 1)) {
            decMrx[idH] = new TRIPLERGB[bmInfo.biWidth];
            int idW = 0;
            for (size_t j = 0; j < originW; j++) {
                if ((j % k) == (k - 1)) {
                    decMrx[idH][idW].red = mrx[i][j].red;
                    decMrx[idH][idW].green = mrx[i][j].green;
                    decMrx[idH][idW].blue = mrx[i][j].blue;
                    idW++;
                }
            }
            idH++;
        }
    }
    saveBMPFile(bmFile, bmInfo, decMrx, filepath);
    return decMrx;
}